

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r6p_iter.cpp
# Opt level: O3

int R6PIter(MatrixXd *X,MatrixXd *u,Vector3d *vk,double r0,RSDoublelinCameraPoseVector *results)

{
  double dVar1;
  double dVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  double *pdVar16;
  double *pdVar17;
  undefined8 *puVar18;
  Index row_15;
  double *pdVar19;
  double *pdVar20;
  long lVar21;
  Index row_16;
  ulong uVar22;
  Index inner_4;
  Index row_7;
  long lVar23;
  Index row_6;
  Index row;
  long lVar24;
  long lVar25;
  DstEvaluatorType dstEvaluator;
  MatrixXd n;
  SrcEvaluatorType srcEvaluator;
  Matrix<double,_12,_13,_0,_12,_13> A;
  assign_op<double,_double> local_be1;
  double *local_be0;
  Vector3d *local_bd8;
  MatrixXd *local_bd0;
  double *local_bc8;
  RSDoublelinCameraPoseVector *local_bc0;
  DstEvaluatorType local_bb8;
  DstXprType local_ba8;
  generic_dense_assignment_kernel<_c64cef4d_> local_b18;
  undefined1 local_af8 [40];
  double *local_ad0;
  undefined1 local_ac8 [16];
  double local_ab8;
  undefined1 local_ab0 [16];
  double *local_aa0;
  double local_a98;
  double dStack_a90;
  double *local_a80;
  double local_a78;
  double *local_a60;
  double local_a58;
  double *local_a40;
  double local_a38;
  double *local_a10;
  double local_a08;
  double *local_9f0;
  double local_9e8;
  double *local_9c8;
  double local_9c0;
  double local_9b0;
  double *local_998;
  double local_990;
  double *local_970;
  double local_968;
  double local_958;
  double *local_940;
  double local_938;
  double *local_918;
  double local_910;
  double local_900;
  double *local_8e8;
  double local_8e0;
  undefined8 auStack_568 [9];
  undefined2 local_51f;
  Matrix<double,_12,_13,_0,_12,_13> local_518;
  
  local_ac8._8_8_ = local_ac8._0_8_;
  local_bc0 = results;
  memset(&local_518,0,0x4e0);
  local_ad0 = (X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data
  ;
  local_a78 = (double)(X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                      m_storage.m_rows;
  local_a80 = local_ad0 + 2;
  local_a10 = local_ad0 + 1;
  local_aa0 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data
  ;
  local_a98 = (double)(u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                      m_storage.m_rows;
  local_a40 = local_aa0 + 1;
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
  .m_rows.m_value =
       (u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  if (0 < local_ba8.
          super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
          .m_rows.m_value) {
    lVar24 = 0;
    pdVar16 = local_a40;
    pdVar17 = local_a80;
    do {
      local_518.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
      array[lVar24] = pdVar17[-1] * *pdVar16 + *pdVar17;
      lVar24 = lVar24 + 1;
      pdVar16 = pdVar16 + (long)local_a98;
      pdVar17 = pdVar17 + (long)local_a78;
    } while (local_ba8.
             super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
             .
             super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
             .
             super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
             .m_rows.m_value != lVar24);
    lVar24 = 0;
    pdVar16 = local_aa0;
    pdVar17 = local_a10;
    do {
      *(double *)
       ((long)local_518.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.
              m_data.array + lVar24 * 8 + 0x30) = -*pdVar17 * *pdVar16;
      lVar24 = lVar24 + 1;
      pdVar16 = pdVar16 + (long)local_a98;
      pdVar17 = pdVar17 + (long)local_a78;
    } while (local_ba8.
             super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
             .
             super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
             .
             super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
             .m_rows.m_value != lVar24);
    lVar24 = 0;
    pdVar16 = local_a40;
    pdVar17 = local_ad0;
    do {
      *(double *)
       ((long)local_518.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.
              m_data.array + lVar24 * 8 + 0x60) = -*pdVar17 * *pdVar16;
      lVar24 = lVar24 + 1;
      pdVar16 = pdVar16 + (long)local_a98;
      pdVar17 = pdVar17 + (long)local_a78;
    } while (local_ba8.
             super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
             .
             super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
             .
             super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
             .m_rows.m_value != lVar24);
    lVar24 = 0;
    pdVar16 = local_aa0;
    pdVar17 = local_a80;
    do {
      *(double *)
       ((long)local_518.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.
              m_data.array + lVar24 * 8 + 0x90) = pdVar17[-2] * *pdVar16 + *pdVar17;
      lVar24 = lVar24 + 1;
      pdVar16 = pdVar16 + (long)local_a98;
      pdVar17 = pdVar17 + (long)local_a78;
    } while (local_ba8.
             super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
             .
             super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
             .
             super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
             .m_rows.m_value != lVar24);
  }
  lVar24 = (X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  if (0 < lVar24) {
    lVar25 = 0;
    pdVar16 = local_ad0;
    do {
      *(double *)
       ((long)local_518.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.
              m_data.array + lVar25 * 8 + 0xc0) = -*pdVar16;
      lVar25 = lVar25 + 1;
      pdVar16 = pdVar16 + (long)local_a78;
    } while (lVar24 != lVar25);
    lVar25 = 0;
    pdVar16 = local_a10;
    do {
      *(double *)
       ((long)local_518.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.
              m_data.array + lVar25 * 8 + 0xf0) = -*pdVar16;
      lVar25 = lVar25 + 1;
      pdVar16 = pdVar16 + (long)local_a78;
    } while (lVar24 != lVar25);
  }
  local_bb8.
  super_block_evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .
  super_mapbase_evaluator<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,_12,_1>_>
  .m_data = (PointerType)
            ((long)local_518.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.
                   m_storage.m_data.array + 0x120);
  local_958 = (vk->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
              array[0];
  local_ab8 = (vk->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
              array[1];
  local_9b0 = (vk->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
              array[2];
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
  .m_cols.m_value = 1;
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .m_xpr.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,_1>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,_0>
  .m_rows.m_value = 6;
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .m_xpr.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
  .m_xpr.super_BlockImpl<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true,_true>.m_xpr =
       &local_518;
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .m_xpr.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
  .m_xpr.super_BlockImpl<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true,_true>.m_startRow.
  m_value = 0;
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .m_xpr.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
  .m_xpr.super_BlockImpl<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true,_true>.m_startCol.
  m_value = 3;
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .m_xpr.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
  .m_xpr.super_BlockImpl<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true,_true>.m_outerStride =
       0xc;
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .m_xpr.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
  .m_startRow.m_value = 0;
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .m_xpr.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
  .m_outerStride = 0xc;
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .m_startRow.m_value = 0;
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .m_startCol.m_value = 0;
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .m_outerStride = 0xc;
  local_b18.m_dst = &local_bb8;
  local_b18.m_functor = &local_be1;
  local_bd0 = X;
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
  .m_data = local_bb8.
            super_block_evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
            .
            super_mapbase_evaluator<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,_12,_1>_>
            .m_data;
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .m_xpr.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,_1>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,_0>
  .m_data = local_bb8.
            super_block_evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
            .
            super_mapbase_evaluator<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,_12,_1>_>
            .m_data;
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .m_xpr.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
  .m_xpr.super_BlockImpl<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,_0>.m_data =
       local_bb8.
       super_block_evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
       .
       super_mapbase_evaluator<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,_12,_1>_>
       .m_data;
  local_b18.m_src = (SrcEvaluatorType *)local_af8;
  local_b18.m_dstExpr = &local_ba8;
  local_a60 = local_aa0;
  local_a58 = local_a98;
  local_a38 = local_a98;
  local_a08 = local_a78;
  local_9f0 = local_aa0;
  local_9e8 = local_a98;
  local_9c8 = local_ad0;
  local_9c0 = local_a78;
  local_998 = local_aa0;
  local_990 = local_a98;
  local_970 = local_a80;
  local_968 = local_a78;
  local_940 = local_aa0;
  local_938 = local_a98;
  local_918 = local_a10;
  local_910 = local_a78;
  local_900 = local_958;
  local_8e8 = local_aa0;
  local_8e0 = local_a98;
  local_ac8._0_8_ = local_a78;
  Eigen::internal::dense_assignment_loop<$a3657759$>::run
            ((generic_dense_assignment_kernel<_1fd48d7f_> *)&local_b18);
  local_aa0 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data
  ;
  local_a98 = (double)(u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                      m_storage.m_rows;
  local_ad0 = (X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data
  ;
  local_a78 = (double)(X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                      m_storage.m_rows;
  local_be0 = local_ad0 + 1;
  local_900 = (vk->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
              array[0];
  local_9b0 = (vk->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
              array[2];
  local_a80 = local_ad0 + 2;
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
  .m_rows.m_value =
       (u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  if (local_ba8.
      super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
      .m_rows.m_value < 1) {
    local_ab8 = (vk->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
                array[1];
  }
  else {
    lVar24 = 0;
    pdVar16 = local_aa0;
    pdVar17 = local_a80;
    do {
      dVar1 = *pdVar16;
      *(double *)
       ((long)local_518.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.
              m_data.array + lVar24 * 8 + 0x150) =
           (*pdVar17 * local_900 * dVar1 + (-dVar1 * local_9b0 * pdVar17[-2] - dVar1 * pdVar17[-1]))
           * dVar1;
      lVar24 = lVar24 + 1;
      pdVar17 = pdVar17 + (long)local_a78;
      pdVar16 = pdVar16 + (long)local_a98;
    } while (local_ba8.
             super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
             .
             super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
             .
             super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
             .m_rows.m_value != lVar24);
    pdVar16 = local_aa0 + 1;
    local_ab8 = (vk->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
                array[1];
    lVar24 = 0;
    pdVar17 = local_be0;
    do {
      dVar1 = pdVar16[-1];
      *(double *)
       ((long)local_518.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.
              m_data.array + lVar24 * 8 + 0x180) =
           ((dVar1 * *pdVar17 * local_9b0 - pdVar17[-1] * dVar1) - dVar1 * pdVar17[1] * local_ab8) *
           *pdVar16;
      lVar24 = lVar24 + 1;
      pdVar17 = pdVar17 + (long)local_a78;
      pdVar16 = pdVar16 + (long)local_a98;
      local_bc8 = local_a80;
    } while (local_ba8.
             super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
             .
             super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
             .
             super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
             .m_rows.m_value != lVar24);
  }
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .m_xpr.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
  .m_xpr.super_BlockImpl<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,_0>.m_data =
       (PointerType)
       ((long)local_518.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.
              m_data.array + 0x180);
  local_bb8.
  super_block_evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .
  super_mapbase_evaluator<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,_12,_1>_>
  .m_data = (PointerType)
            ((long)local_518.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.
                   m_storage.m_data.array + 0x1b0);
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
  .m_cols.m_value = 1;
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .m_xpr.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,_1>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,_0>
  .m_rows.m_value = 6;
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .m_xpr.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
  .m_xpr.super_BlockImpl<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true,_true>.m_xpr =
       &local_518;
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .m_xpr.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
  .m_xpr.super_BlockImpl<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true,_true>.m_startRow.
  m_value = 0;
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .m_xpr.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
  .m_xpr.super_BlockImpl<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true,_true>.m_startCol.
  m_value = 4;
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .m_xpr.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
  .m_xpr.super_BlockImpl<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true,_true>.m_outerStride =
       0xc;
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .m_xpr.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
  .m_startRow.m_value = 6;
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .m_xpr.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
  .m_outerStride = 0xc;
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .m_startRow.m_value = 0;
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .m_startCol.m_value = 0;
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .m_outerStride = 0xc;
  local_ac8._0_8_ = local_a78;
  local_b18.m_dst = &local_bb8;
  local_b18.m_functor = &local_be1;
  local_bd8 = vk;
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
  .m_data = local_bb8.
            super_block_evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
            .
            super_mapbase_evaluator<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,_12,_1>_>
            .m_data;
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .m_xpr.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,_1>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,_0>
  .m_data = local_bb8.
            super_block_evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
            .
            super_mapbase_evaluator<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,_12,_1>_>
            .m_data;
  local_b18.m_src = (SrcEvaluatorType *)local_af8;
  local_b18.m_dstExpr = &local_ba8;
  local_a60 = local_aa0;
  local_a58 = local_a98;
  local_a40 = local_aa0;
  local_a38 = local_a98;
  local_a10 = local_ad0;
  local_a08 = local_a78;
  local_9f0 = local_aa0;
  local_9e8 = local_a98;
  local_9c8 = local_be0;
  local_9c0 = local_a78;
  local_998 = local_aa0;
  local_990 = local_a98;
  local_970 = local_a80;
  local_968 = local_a78;
  local_958 = local_ab8;
  local_940 = local_aa0;
  local_938 = local_a98;
  local_918 = local_be0;
  local_910 = local_a78;
  local_8e8 = local_aa0;
  local_8e0 = local_a98;
  Eigen::internal::dense_assignment_loop<$2f2011cb$>::run(&local_b18);
  pdVar17 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  lVar24 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  pdVar20 = (local_bd0->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
            m_data;
  lVar25 = (local_bd0->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_rows;
  pdVar16 = pdVar20 + 2;
  lVar3 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  if (0 < lVar3) {
    pdVar20 = pdVar20 + 1;
    dVar1 = (local_bd8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
            m_data.array[1];
    dVar8 = (local_bd8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
            m_data.array[2];
    lVar23 = 0;
    pdVar19 = pdVar17;
    do {
      dVar2 = *pdVar19;
      *(double *)
       ((long)local_518.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.
              m_data.array + lVar23 * 8 + 0x1e0) =
           (dVar2 * *pdVar20 * dVar8 - pdVar20[-1] * dVar2) - dVar2 * pdVar20[1] * dVar1;
      lVar23 = lVar23 + 1;
      pdVar19 = pdVar19 + lVar24;
      pdVar20 = pdVar20 + lVar25;
    } while (lVar3 != lVar23);
    dVar1 = (local_bd8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
            m_data.array[0];
    lVar23 = 0;
    pdVar20 = pdVar17;
    pdVar19 = pdVar16;
    do {
      dVar2 = *pdVar20;
      *(double *)
       ((long)local_518.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.
              m_data.array + lVar23 * 8 + 0x210) =
           *pdVar19 * dVar1 * dVar2 + (-dVar2 * dVar8 * pdVar19[-2] - dVar2 * pdVar19[-1]);
      lVar23 = lVar23 + 1;
      pdVar20 = pdVar20 + lVar24;
      pdVar19 = pdVar19 + lVar25;
    } while (lVar3 != lVar23);
  }
  uVar22 = 0xfffffffffffffffe;
  do {
    *(undefined8 *)
     ((long)local_518.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.
            m_data.array + uVar22 * 8 + 0x280) = 0x3ff0000000000000;
    *(undefined8 *)
     ((long)local_518.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.
            m_data.array + uVar22 * 8 + 0x288) = 0x3ff0000000000000;
    uVar22 = uVar22 + 2;
  } while (uVar22 < 4);
  uVar22 = 0xfffffffffffffffe;
  do {
    *(undefined8 *)
     ((long)local_518.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.
            m_data.array + uVar22 * 8 + 0x2b0) = 0xbff0000000000000;
    *(undefined8 *)
     ((long)local_518.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.
            m_data.array + uVar22 * 8 + 0x2b8) = 0xbff0000000000000;
    uVar22 = uVar22 + 2;
  } while (uVar22 < 4);
  pdVar20 = pdVar17 + 1;
  if (0 < lVar3) {
    lVar23 = 0;
    pdVar19 = pdVar20;
    do {
      *(double *)
       ((long)local_518.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.
              m_data.array + lVar23 * 8 + 0x300) = *pdVar19;
      lVar23 = lVar23 + 1;
      pdVar19 = pdVar19 + lVar24;
    } while (lVar3 != lVar23);
    lVar23 = 0;
    pdVar19 = pdVar17;
    do {
      *(double *)
       ((long)local_518.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.
              m_data.array + lVar23 * 8 + 0x330) = -*pdVar19;
      lVar23 = lVar23 + 1;
      pdVar19 = pdVar19 + lVar24;
    } while (lVar3 != lVar23);
    lVar23 = 0;
    pdVar19 = pdVar17;
    do {
      *(double *)
       ((long)local_518.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.
              m_data.array + lVar23 * 8 + 0x390) = *pdVar19;
      lVar23 = lVar23 + 1;
      pdVar19 = pdVar19 + lVar24;
    } while (lVar3 != lVar23);
    lVar23 = 0;
    pdVar19 = pdVar17;
    do {
      *(double *)
       ((long)local_518.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.
              m_data.array + lVar23 * 8 + 0x3c0) = -*pdVar19;
      lVar23 = lVar23 + 1;
      pdVar19 = pdVar19 + lVar24;
    } while (lVar3 != lVar23);
    lVar23 = 0;
    pdVar19 = pdVar20;
    do {
      *(double *)
       ((long)local_518.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.
              m_data.array + lVar23 * 8 + 0x420) = *pdVar19 * pdVar19[-1];
      lVar23 = lVar23 + 1;
      pdVar19 = pdVar19 + lVar24;
    } while (lVar3 != lVar23);
    lVar23 = 0;
    pdVar19 = pdVar17;
    do {
      *(double *)
       ((long)local_518.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.
              m_data.array + lVar23 * 8 + 0x450) = -*pdVar19 * *pdVar19;
      lVar23 = lVar23 + 1;
      pdVar19 = pdVar19 + lVar24;
    } while (lVar3 != lVar23);
  }
  lVar23 = (local_bd0->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_cols;
  if (0 < lVar23) {
    lVar21 = 0;
    pdVar19 = pdVar16;
    do {
      *(double *)
       ((long)local_518.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.
              m_data.array + lVar21 * 8 + 0x480) = *pdVar19 * *pdVar20 - pdVar19[-1];
      lVar21 = lVar21 + 1;
      pdVar20 = pdVar20 + lVar24;
      pdVar19 = pdVar19 + lVar25;
    } while (lVar23 != lVar21);
  }
  if (0 < lVar3) {
    lVar23 = 0;
    do {
      *(double *)
       ((long)local_518.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.
              m_data.array + lVar23 * 8 + 0x4b0) = pdVar16[-2] - *pdVar16 * *pdVar17;
      lVar23 = lVar23 + 1;
      pdVar17 = pdVar17 + lVar24;
      pdVar16 = pdVar16 + lVar25;
    } while (lVar3 != lVar23);
  }
  local_51f._0_1_ = false;
  local_51f._1_1_ = false;
  lVar24 = 0x50;
  do {
    uVar9 = *(undefined8 *)((long)auStack_568 + lVar24 + 8);
    uVar10 = *(undefined8 *)((long)auStack_568 + lVar24 + 0x10);
    uVar11 = *(undefined8 *)((long)auStack_568 + lVar24 + 0x18);
    uVar12 = *(undefined8 *)((long)auStack_568 + lVar24 + 0x20);
    uVar13 = *(undefined8 *)((long)auStack_568 + lVar24 + 0x28);
    uVar14 = *(undefined8 *)((long)auStack_568 + lVar24 + 0x30);
    uVar15 = *(undefined8 *)((long)auStack_568 + lVar24 + 0x38);
    *(undefined8 *)
     ((long)&local_ba8.
             super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
             .m_xpr.
             super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
     + lVar24 + 0x48) = *(undefined8 *)((long)auStack_568 + lVar24);
    *(undefined8 *)
     ((long)&local_ba8.
             super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
             .m_xpr.
             super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
     + lVar24 + 0x50) = uVar9;
    *(undefined8 *)
     ((long)&local_ba8.
             super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
             .m_xpr.
             super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
     + lVar24 + 0x58) = uVar10;
    *(undefined8 *)
     ((long)&local_ba8.
             super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
             .m_startRow.m_value + lVar24) = uVar11;
    *(undefined8 *)
     ((long)&local_ba8.
             super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
             .m_startCol.m_value + lVar24) = uVar12;
    *(undefined8 *)
     ((long)&local_ba8.
             super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
             .m_outerStride + lVar24) = uVar13;
    *(undefined8 *)((long)&local_b18.m_dst + lVar24) = uVar14;
    *(undefined8 *)(local_af8 + lVar24 + -0x18) = uVar15;
    uVar9 = *(undefined8 *)(&stack0xfffffffffffffae0 + lVar24);
    *(undefined8 *)(local_af8 + lVar24 + -0x10) = *(undefined8 *)((long)auStack_568 + lVar24 + 0x40)
    ;
    *(undefined8 *)(local_af8 + lVar24 + -8) = uVar9;
    uVar9 = *(undefined8 *)
             ((long)local_518.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.
                    m_storage.m_data.array + lVar24 + 8);
    *(undefined8 *)(local_af8 + lVar24) =
         *(undefined8 *)
          ((long)local_518.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.
                 m_storage.m_data.array + lVar24);
    *(undefined8 *)(local_af8 + lVar24 + 8) = uVar9;
    lVar24 = lVar24 + 0x60;
  } while (lVar24 != 0x530);
  Eigen::FullPivLU<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>::computeInPlace
            ((FullPivLU<Eigen::Matrix<double,_12,_13,_0,_12,_13>_> *)local_af8);
  Eigen::internal::kernel_retval_base<Eigen::FullPivLU<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>_>
  ::kernel_retval_base
            ((kernel_retval_base<Eigen::FullPivLU<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>_> *)
             &local_b18,(FullPivLU<Eigen::Matrix<double,_12,_13,_0,_12,_13>_> *)local_af8);
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
  .m_data = (PointerType)0x0;
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
  .m_rows.m_value = 0;
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
  .m_cols.m_value = 0;
  if ((local_b18.m_functor != (assign_op<double,_double> *)0x0) &&
     (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816((long)local_b18.m_functor)
             ,0) < 0xd)) {
    puVar18 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar18 = std::ostream::_M_insert<long>;
    __cxa_throw(puVar18,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)&local_ba8,(long)local_b18.m_functor * 0xd,0xd,
             (Index)local_b18.m_functor);
  Eigen::internal::kernel_retval<Eigen::FullPivLU<Eigen::Matrix<double,12,13,0,12,13>>>::
  evalTo<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((kernel_retval<Eigen::FullPivLU<Eigen::Matrix<double,12,13,0,12,13>>> *)&local_b18,
             (Matrix<double,__1,__1,_0,__1,__1> *)&local_ba8);
  lVar24 = ((int)local_ba8.
                 super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
                 .
                 super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
                 .
                 super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
                 .m_cols.m_value + -1) *
           local_ba8.
           super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
           .
           super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
           .
           super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
           .
           super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
           .m_rows.m_value;
  dVar1 = local_ba8.
          super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
          .m_data[lVar24 + 0xc];
  local_af8._16_8_ =
       local_ba8.
       super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
       .
       super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
       .
       super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
       .
       super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
       .m_data[lVar24 + 2] / dVar1;
  local_ab8 = local_ba8.
              super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
              .
              super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
              .
              super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
              .
              super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
              .m_data[lVar24 + 5] / dVar1;
  local_ad0 = (double *)
              (local_ba8.
               super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
               .
               super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
               .
               super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
               .
               super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
               .m_data[lVar24 + 8] / dVar1);
  local_aa0 = (double *)
              (local_ba8.
               super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
               .
               super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
               .
               super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
               .
               super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
               .m_data[lVar24 + 0xb] / dVar1);
  auVar4._8_8_ = dVar1;
  auVar4._0_8_ = dVar1;
  local_af8._0_16_ =
       divpd(*(undefined1 (*) [16])
              (local_ba8.
               super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
               .
               super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
               .
               super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
               .
               super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
               .m_data + lVar24),auVar4);
  auVar5._8_8_ = dVar1;
  auVar5._0_8_ = dVar1;
  local_ac8 = divpd(*(undefined1 (*) [16])
                     (local_ba8.
                      super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
                      .
                      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
                      .
                      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
                      .m_data + lVar24 + 3),auVar5);
  auVar6._8_8_ = dVar1;
  auVar6._0_8_ = dVar1;
  local_af8._24_16_ =
       divpd(*(undefined1 (*) [16])
              (local_ba8.
               super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
               .
               super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
               .
               super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
               .
               super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
               .m_data + lVar24 + 6),auVar6);
  auVar7._8_8_ = dVar1;
  auVar7._0_8_ = dVar1;
  local_ab0 = divpd(*(undefined1 (*) [16])
                     (local_ba8.
                      super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
                      .
                      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
                      .
                      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
                      .m_data + lVar24 + 9),auVar7);
  local_a98 = 1.0;
  dStack_a90 = 0.0;
  std::vector<RSDoublelinCameraPose,_std::allocator<RSDoublelinCameraPose>_>::
  emplace_back<RSDoublelinCameraPose>(local_bc0,(RSDoublelinCameraPose *)local_af8);
  free(local_ba8.
       super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
       .
       super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
       .
       super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
       .
       super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
       .m_data);
  return 0;
}

Assistant:

int R6PIter(const Eigen::MatrixXd & X, const Eigen::MatrixXd & u, const Eigen::Vector3d & vk, double r0, RSDoublelinCameraPoseVector * results){
    Eigen::Matrix<double,12,13> A = Eigen::Matrix<double,12,13>::Zero();
    A.col(0).head(6) << X.row(2).transpose().array() + X.row(1).transpose().array() * u.row(1).transpose().array();  
    A.col(0).tail(6) << -X.row(1).transpose().array() * u.row(0).transpose().array();
    A.col(1).head(6) << -X.row(0).transpose().array() * u.row(1).transpose().array();
    A.col(1).tail(6) << X.row(2).transpose().array() + X.row(0).transpose().array() * u.row(0).transpose().array();
    A.col(2).head(6) << - X.row(0).transpose().array();
    A.col(2).tail(6) << - X.row(1).transpose().array();
    A.col(3).head(6) << X.row(0).transpose().array() * vk(1) * (-u.row(0).transpose().array()) - X.row(2).transpose().array() * (- u.row(0).transpose().array()) - u.row(1).transpose().array() * (X.row(1).transpose().array() * ( -u.row(0).transpose().array()) + X.row(0).transpose().array() * vk(2) * (-u.row(0).transpose().array()) - X.row(2).transpose().array() * vk(0) * (-u.row(0).transpose().array())) - X.row(1).transpose().array() * vk(0) * (-u.row(0).transpose().array());
    A.col(3).tail(6) << u.row(0).transpose().array() * (X.row(1).transpose().array() * (-u.row(0).transpose().array()) + X.row(0).transpose().array() * vk(2) * (-u.row(0).transpose().array()) - X.row(2).transpose().array() * vk(0) * (-u.row(0).transpose().array()));
    A.col(4).head(6) << u.row(1).transpose().array() * (X.row(0).transpose().array() * (-u.row(0).transpose().array()) - X.row(1).transpose().array() * vk(2) * (-u.row(0).transpose().array()) + X.row(2).transpose().array() * vk(1) * (-u.row(0).transpose().array()));
    A.col(4).tail(6) << X.row(0).transpose().array() * vk(1) * (-u.row(0).transpose().array()) - X.row(2).transpose().array() * (-u.row(0).transpose().array()) - u.row(0).transpose().array() * (X.row(0).transpose().array() * (-u.row(0).transpose().array()) -X.row(1).transpose().array() * vk(2) * (-u.row(0).transpose().array()) + X.row(2).transpose().array() * vk(1) * (-u.row(0).transpose().array())) - X.row(1).transpose().array() * vk(0) * (-u.row(0).transpose().array());
    A.col(5).head(6) << X.row(0).transpose().array() * (-u.row(0).transpose().array()) - X.row(1).transpose().array() * vk(2) * (-u.row(0).transpose().array()) + X.row(2).transpose().array() * vk(1) * (-u.row(0).transpose().array());
    A.col(5).tail(6) << X.row(1).transpose().array() * (-u.row(0).transpose().array()) + X.row(0).transpose().array() * vk(2) * (-u.row(0).transpose().array()) - X.row(2).transpose().array() * vk(0) * (-u.row(0).transpose().array());
    A.col(6).tail(6) << Eigen::MatrixXd::Ones(6,1);
    A.col(7).head(6) << -Eigen::MatrixXd::Ones(6,1);
    A.col(8).head(6) << u.row(1).transpose().array();
    A.col(8).tail(6) << -u.row(0).transpose().array();
    A.col(9).tail(6) << u.row(0).transpose().array();
    A.col(10).head(6) << -u.row(0).transpose().array();
    A.col(11).head(6) << -u.row(1).transpose().array() * (-u.row(0).transpose().array());
    A.col(11).tail(6) << u.row(0).transpose().array() * (-u.row(0).transpose().array());
    A.col(12).head(6) << X.row(2).transpose().array() * u.row(1).transpose().array() - X.row(1).transpose().array();
    A.col(12).tail(6) << X.row(0).transpose().array() - X.row(2).transpose().array() * u.row(0).transpose().array();
    Eigen::MatrixXd n = A.fullPivLu().kernel();
    // std::cout << "A inverse done \n";
    int end = n.cols()-1;
    double s = n(12,end);
    // std::cout << "scalar done \n";
    Eigen::Vector3d v = n.col(end).head(3)/s; 
    // std::cout << "v: \n" << v << "\n";
    Eigen::Vector3d w = n.col(end).segment(3,3)/s;
    // std::cout << "w done \n" << w << "\n";
    Eigen::Vector3d C = n.col(end).segment(6,3)/s;
    // std::cout << "C done \n" << C << "\n";
    Eigen::Vector3d t = n.col(end).segment(9,3)/s;
    // std::cout << "t done \n" << t << "\n";

    results->push_back({v, C, w, t, 1, 0});

    return 0;

}